

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<>(ArenaStringPtr *this,Arena *arena)

{
  type_info *in_RSI;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string *new_string;
  string *default_value;
  size_t n;
  size_t in_stack_ffffffffffffff00;
  ArenaImpl *in_stack_ffffffffffffff10;
  _func_void_void_ptr *in_stack_ffffffffffffff20;
  ArenaImpl *in_stack_ffffffffffffff30;
  undefined8 local_38;
  
  GetEmptyStringAlreadyInited_abi_cxx11_();
  if (in_RSI == (type_info *)0x0) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    std::__cxx11::string::string((string *)local_38);
  }
  else {
    AlignUpTo8(0x20);
    ArenaImpl::RecordAlloc(in_stack_ffffffffffffff10,in_RSI,in_stack_ffffffffffffff00);
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (in_stack_ffffffffffffff30,(size_t)in_RDI,in_stack_ffffffffffffff20);
    std::__cxx11::string::string((string *)local_38);
  }
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
            (in_RDI,local_38);
  return local_38;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}